

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateRegressorInterface
                   (Result *__return_storage_ptr__,ModelDescription *description,int modelVersion)

{
  string *features;
  bool bVar1;
  int iVar2;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  allocator_type local_69;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  undefined1 local_58 [24];
  string local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)(description->predictedfeaturename_).ptr_);
  if (iVar2 == 0) {
    local_68 = (undefined1  [8])local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Specification is missing regressor predictedFeatureName.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_68);
    if (local_68 != (undefined1  [8])local_58) {
      operator_delete((void *)local_68,local_58._0_8_ + 1);
    }
  }
  else {
    validateFeatureDescriptions(__return_storage_ptr__,description,modelVersion);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      features = (description->predictedfeaturename_).ptr_;
      local_40.field_2._8_8_ = 0x500000002;
      __l._M_len = 2;
      __l._M_array = (iterator)((long)&local_40.field_2 + 8);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_40,__l,&local_69);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_68,(CoreML *)&description->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)features,&local_40,
                 in_R8);
      __return_storage_ptr__->m_type = local_68._0_4_;
      __return_storage_ptr__->m_reason = local_68._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_60);
      if (local_60._M_p != local_58 + 8) {
        operator_delete(local_60._M_p,local_58._8_8_ + 1);
      }
      if (local_40._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_40._M_dataplus._M_p,
                        local_40.field_2._M_allocated_capacity - (long)local_40._M_dataplus._M_p);
      }
      Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateRegressorInterface(const Specification::ModelDescription& description, int modelVersion) {
        
        if (description.predictedfeaturename() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing regressor predictedFeatureName.");
        }
        
        // Validate feature descriptions
        Result result = validateFeatureDescriptions(description, modelVersion);
        if (!result.good()) {
            return result;
        }

        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   description.predictedfeaturename(),
                                                                   {Specification::FeatureType::kDoubleType, Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        return result;
    }